

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::expression
          (SelectionEvaluator *this,vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *code,
          int pcStart,int frame)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  reference this_00;
  uint in_ECX;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_RDX;
  Token *in_RSI;
  SelectionSet *in_RDI;
  Token instruction;
  uint pc;
  stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
  stack;
  SelectionSet bs;
  string *in_stack_fffffffffffffd78;
  SelectionEvaluator *in_stack_fffffffffffffd80;
  SelectionEvaluator *in_stack_fffffffffffffd88;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd90;
  allocator<char> *in_stack_fffffffffffffdb0;
  SelectionEvaluator *in_stack_fffffffffffffdb8;
  SelectionEvaluator *in_stack_fffffffffffffdc0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc8;
  SelectionSet *in_stack_fffffffffffffdd0;
  SelectionSet *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  SelectionSet *bs_00;
  SelectionEvaluator *in_stack_fffffffffffffe10;
  SelectionEvaluator *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe2c;
  Token *in_stack_fffffffffffffe30;
  SelectionEvaluator *in_stack_fffffffffffffe38;
  string local_1b0 [80];
  string local_160 [88];
  SelectionEvaluator *in_stack_fffffffffffffef8;
  vector<int,_std::allocator<int>_> local_e0 [2];
  int local_b0;
  uint local_98;
  SelectionSet local_38;
  uint local_1c;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *local_18;
  
  bs_00 = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  createSelectionSets(in_stack_fffffffffffffdb8);
  std::
  stack<OpenMD::SelectionSet,std::deque<OpenMD::SelectionSet,std::allocator<OpenMD::SelectionSet>>>
  ::stack<std::deque<OpenMD::SelectionSet,std::allocator<OpenMD::SelectionSet>>,void>
            ((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80);
  for (local_98 = local_1c; uVar1 = (ulong)local_98,
      sVar2 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size(local_18),
      uVar1 < sVar2; local_98 = local_98 + 1) {
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[](local_18,(ulong)local_98)
    ;
    Token::Token((Token *)in_stack_fffffffffffffd80,(Token *)in_stack_fffffffffffffd78);
    if (local_b0 == 1) {
      std::any_cast<std::__cxx11::string>((any *)in_stack_fffffffffffffd88);
      lookupValue(in_stack_fffffffffffffe18,(string *)in_stack_fffffffffffffe10);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      SelectionSet::~SelectionSet((SelectionSet *)0x303616);
      std::__cxx11::string::~string(local_1b0);
    }
    else if (local_b0 == 0x403) {
      in_stack_fffffffffffffdb0 =
           (allocator<char> *)
           std::
           stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
           ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x3032ff);
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::pop((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x303327);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x303336);
      SelectionSet::operator&=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
    }
    else if (local_b0 == 0x404) {
      in_stack_fffffffffffffdc0 =
           (SelectionEvaluator *)
           std::
           stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
           ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x30329b);
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::pop((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x3032c3);
      in_stack_fffffffffffffdb8 =
           (SelectionEvaluator *)
           std::
           stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
           ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x3032d2);
      SelectionSet::operator|=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
    }
    else if (local_b0 == 0x405) {
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x303363);
      SelectionSet::flip((SelectionSet *)in_stack_fffffffffffffd80);
    }
    else if (local_b0 == 0x409) {
      allInstruction(in_stack_fffffffffffffef8);
      in_stack_fffffffffffffde0 = &local_38;
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      SelectionSet::~SelectionSet((SelectionSet *)0x3031b2);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
    }
    else if (local_b0 == 0x40a) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8);
      SelectionSet::SelectionSet(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffdd0 = &local_38;
      in_stack_fffffffffffffdc8 = local_e0;
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      SelectionSet::~SelectionSet((SelectionSet *)0x303242);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd90);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
    }
    else if (local_b0 == 0x40b) {
      std::any_cast<std::__cxx11::string>((any *)in_stack_fffffffffffffd88);
      nameInstruction(in_stack_fffffffffffffd88,(string *)in_stack_fffffffffffffd80);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      SelectionSet::~SelectionSet((SelectionSet *)0x3034f3);
      std::__cxx11::string::~string(local_160);
    }
    else if ((local_b0 != 0x464) && (local_b0 != 0x465)) {
      if (local_b0 == 0x1406) {
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
               *)0x303388);
        withinInstruction(in_stack_fffffffffffffe10,in_RSI,bs_00,(int)((ulong)in_RDI >> 0x20));
      }
      else if (local_b0 == 0x140c) {
        hull((SelectionEvaluator *)CONCAT44(0x140c,in_stack_fffffffffffffde8),
             (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x30346e);
      }
      else if (local_b0 == 0x140d) {
        alphaHullInstruction
                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x303401);
      }
      else if (local_b0 - 0x3400U < 6) {
        comparatorInstruction
                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x3036bb);
      }
      else if (local_b0 == 0x10400) {
        indexInstruction(in_stack_fffffffffffffe38,(any *)in_stack_fffffffffffffe30);
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x303591);
      }
      else {
        unrecognizedExpression(in_stack_fffffffffffffdc0);
      }
    }
    Token::~Token((Token *)0x3036fe);
  }
  sVar3 = std::
          stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
          ::size((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x303733);
  if (sVar3 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0
              );
    evalError(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
  }
  this_00 = std::
            stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
            ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                   *)0x3037fc);
  SelectionSet::SelectionSet(this_00,(SelectionSet *)in_stack_fffffffffffffd78);
  std::
  stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
  ::~stack((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
            *)0x303824);
  SelectionSet::~SelectionSet((SelectionSet *)0x303831);
  return bs_00;
}

Assistant:

SelectionSet SelectionEvaluator::expression(const std::vector<Token>& code,
                                              int pcStart, int frame) {
    SelectionSet bs = createSelectionSets();
    std::stack<SelectionSet> stack;

    for (unsigned int pc = pcStart; pc < code.size(); ++pc) {
      Token instruction = code[pc];

      switch (instruction.tok) {
      case Token::expressionBegin:
        break;
      case Token::expressionEnd:
        break;
      case Token::all:
        bs = allInstruction();
        stack.push(bs);
        break;
      case Token::none:
        bs = SelectionSet(nObjects);
        stack.push(bs);
        break;
      case Token::opOr:
        bs = stack.top();
        stack.pop();
        stack.top() |= bs;
        break;
      case Token::opAnd:
        bs = stack.top();
        stack.pop();
        stack.top() &= bs;
        break;
      case Token::opNot:
        stack.top().flip();
        break;
      case Token::within:
        withinInstruction(instruction, stack.top(), frame);
        break;
      case Token::alphahull:
        stack.push(alphaHullInstruction(instruction, frame));
        break;
      case Token::hull:
        stack.push(hull(frame));
        break;
        // case Token::selected:
        //  stack.push(getSelectionSet());
        //  break;
      case Token::name:
        stack.push(
            nameInstruction(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::index:
        stack.push(indexInstruction(instruction.value));
        break;
      case Token::identifier:
        stack.push(lookupValue(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::opLT:
      case Token::opLE:
      case Token::opGE:
      case Token::opGT:
      case Token::opEQ:
      case Token::opNE:
        stack.push(comparatorInstruction(instruction, frame));
        break;
      default:
        unrecognizedExpression();
      }
    }
    if (stack.size() != 1)
      evalError("atom expression compiler error - stack over/underflow");

    return stack.top();
  }